

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_param_tests.hpp
# Opt level: O0

iuParamGenerator<int> __thiscall iutest::CSV<int>(iutest *this,char *path,char delimiter)

{
  char *__s;
  iuCsvFileParamsGenerator<int> *this_00;
  _Interface *extraout_RDX;
  iuParamGenerator<int> iVar1;
  allocator<char> local_41;
  string local_40;
  char local_19;
  char *pcStack_18;
  char delimiter_local;
  char *path_local;
  
  local_19 = delimiter;
  pcStack_18 = path;
  path_local = (char *)this;
  this_00 = (iuCsvFileParamsGenerator<int> *)operator_new(0x28);
  __s = pcStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  detail::iuCsvFileParamsGenerator<int>::iuCsvFileParamsGenerator(this_00,&local_40,local_19);
  detail::iuParamGenerator<int>::iuParamGenerator
            ((iuParamGenerator<int> *)this,(_Interface *)this_00);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  iVar1.m_pInterface = extraout_RDX;
  iVar1.super_iuIParamGenerator<int>._vptr_iuIParamGenerator = (_func_int **)this;
  return iVar1;
}

Assistant:

detail::iuParamGenerator<T> IUTEST_ATTRIBUTE_UNUSED_ CSV(const char* path, char delimiter = ',')
{
    return new detail::iuCsvFileParamsGenerator<T>(path, delimiter);
}